

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# GlobOptBlockData.cpp
# Opt level: O2

ValueInfo * __thiscall
GlobOptBlockData::MergeValueInfo
          (GlobOptBlockData *this,Value *toDataVal,Value *fromDataVal,Sym *fromDataSym,
          bool isLoopBackEdge,bool sameValueNumber,
          BVSparse<Memory::JitArenaAllocator> *symsRequiringCompensation,
          BVSparse<Memory::JitArenaAllocator> *symsCreatedForMerge)

{
  ValueType *this_00;
  ValueType *this_01;
  ValueType valueType;
  ValueInfo *this_02;
  code *pcVar1;
  anon_union_2_4_ea848c7b_for_ValueType_13 mergedValueType;
  bool bVar2;
  bool bVar3;
  undefined4 *puVar4;
  JsTypeValueInfo *pJVar5;
  JsTypeValueInfo *fromValueInfo;
  ValueInfo *pVVar6;
  ArrayValueInfo *toDataValueInfo;
  ArrayValueInfo *fromDataValueInfo;
  anon_union_2_4_ea848c7b_for_ValueType_13 local_34;
  anon_union_2_4_ea848c7b_for_ValueType_13 local_32 [3];
  ValueType merged;
  ValueType newValueType;
  
  pVVar6 = toDataVal->valueInfo;
  this_02 = fromDataVal->valueInfo;
  bVar2 = ValueInfo::IsJsType(pVVar6);
  if ((bVar2) || (bVar2 = ValueInfo::IsJsType(this_02), bVar2)) {
    bVar2 = ValueInfo::IsJsType(pVVar6);
    if ((!bVar2) || (bVar2 = ValueInfo::IsJsType(this_02), !bVar2)) {
      AssertCount = AssertCount + 1;
      Js::Throw::LogAssert();
      puVar4 = (undefined4 *)__tls_get_addr(&PTR_013e5f18);
      *puVar4 = 1;
      bVar2 = Js::Throw::ReportAssert
                        ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/GlobOptBlockData.cpp"
                         ,0x3b0,"(toDataValueInfo->IsJsType() && fromDataValueInfo->IsJsType())",
                         "toDataValueInfo->IsJsType() && fromDataValueInfo->IsJsType()");
      if (!bVar2) {
        pcVar1 = (code *)invalidInstructionException();
        (*pcVar1)();
      }
      *puVar4 = 0;
    }
    pJVar5 = ValueInfo::AsJsType(pVVar6);
    fromValueInfo = ValueInfo::AsJsType(this_02);
    pJVar5 = MergeJsTypeValueInfo(this,pJVar5,fromValueInfo,isLoopBackEdge,sameValueNumber);
    return &pJVar5->super_ValueInfo;
  }
  if (pVVar6 == this_02) {
    return pVVar6;
  }
  this_00 = &pVVar6->super_ValueType;
  valueType.field_0 =
       (anon_union_2_4_ea848c7b_for_ValueType_13)
       *(anon_union_2_4_ea848c7b_for_ValueType_13 *)&(this_02->super_ValueType).field_0.field_0;
  ValueType::Verify((ValueType)
                    *(anon_union_2_4_ea848c7b_for_ValueType_13 *)
                     &(pVVar6->super_ValueType).field_0.field_0);
  ValueType::Verify(valueType);
  bVar2 = ValueType::operator==(this_00,valueType);
  if (bVar2) {
    local_32[0].field_0 = (this_00->field_0).field_0;
  }
  else {
    ValueType::ValueType
              ((ValueType *)&local_34.field_0,(this_00->field_0).bits | (ushort)valueType.field_0);
    bVar2 = ValueType::OneOn((ValueType *)&local_34.field_0,Object);
    if (bVar2) {
      local_32[0].field_0 =
           (anon_struct_2_1_ebef698d_for_anon_union_2_4_ea848c7b_for_ValueType_13_0)
           ValueType::MergeWithObject(this_00,valueType);
    }
    else {
      local_32[0].field_0 =
           (anon_struct_2_1_ebef698d_for_anon_union_2_4_ea848c7b_for_ValueType_13_0)
           ValueType::Verify(local_34.field_0);
    }
  }
  bVar2 = ValueType::IsLikelyInt((ValueType *)&local_32[0].field_0);
  if (bVar2) {
    pVVar6 = ValueInfo::MergeLikelyIntValueInfo
                       (this->globOpt->alloc,toDataVal,fromDataVal,(ValueType)local_32[0].field_0);
    return pVVar6;
  }
  bVar2 = ValueType::IsLikelyAnyOptimizedArray((ValueType *)&local_32[0].field_0);
  if (!bVar2) goto LAB_00463f06;
  bVar2 = ValueType::IsLikelyArrayOrObjectWithArray((ValueType *)&local_32[0].field_0);
  if ((bVar2) && (bVar2 = ValueType::IsLikelyArrayOrObjectWithArray(this_00), bVar2)) {
    this_01 = &this_02->super_ValueType;
    bVar2 = ValueType::IsLikelyArrayOrObjectWithArray(this_01);
    if (bVar2) {
      bVar2 = ValueType::HasNoMissingValues(this_00);
      if (bVar2) {
        bVar2 = ValueType::HasNoMissingValues(this_01);
      }
      else {
        bVar2 = false;
      }
      local_32[0].field_0 =
           (anon_struct_2_1_ebef698d_for_anon_union_2_4_ea848c7b_for_ValueType_13_0)
           ValueType::SetHasNoMissingValues((ValueType *)&local_32[0].field_0,bVar2);
      bVar2 = ValueType::HasIntElements(this_00);
      bVar3 = ValueType::HasIntElements(this_01);
      if (bVar2 == bVar3) {
        bVar2 = ValueType::HasFloatElements(this_00);
        bVar3 = ValueType::HasFloatElements(this_01);
        if (bVar2 == bVar3) goto LAB_00463ea3;
      }
      local_32[0].field_0 =
           (anon_struct_2_1_ebef698d_for_anon_union_2_4_ea848c7b_for_ValueType_13_0)
           ValueType::ToLikely((ValueType *)&local_32[0].field_0);
    }
  }
LAB_00463ea3:
  bVar2 = ValueType::IsObject((ValueType *)&local_32[0].field_0);
  if (((bVar2) && (bVar2 = ValueInfo::IsArrayValueInfo(pVVar6), bVar2)) &&
     (bVar2 = ValueInfo::IsArrayValueInfo(this_02), mergedValueType = local_32[0], bVar2)) {
    toDataValueInfo = ValueInfo::AsArrayValueInfo(pVVar6);
    fromDataValueInfo = ValueInfo::AsArrayValueInfo(this_02);
    pVVar6 = MergeArrayValueInfo(this,(ValueType)mergedValueType.field_0,toDataValueInfo,
                                 fromDataValueInfo,fromDataSym,symsRequiringCompensation,
                                 symsCreatedForMerge,isLoopBackEdge);
    return pVVar6;
  }
LAB_00463f06:
  pVVar6 = ValueInfo::New(this->globOpt->alloc,(ValueType)local_32[0].field_0);
  return pVVar6;
}

Assistant:

ValueInfo *
GlobOptBlockData::MergeValueInfo(
    Value *toDataVal,
    Value *fromDataVal,
    Sym *fromDataSym,
    bool isLoopBackEdge,
    bool sameValueNumber,
    BVSparse<JitArenaAllocator> *const symsRequiringCompensation,
    BVSparse<JitArenaAllocator> *const symsCreatedForMerge)
{
    ValueInfo *const toDataValueInfo = toDataVal->GetValueInfo();
    ValueInfo *const fromDataValueInfo = fromDataVal->GetValueInfo();

    if (toDataValueInfo->IsJsType() || fromDataValueInfo->IsJsType())
    {
        Assert(toDataValueInfo->IsJsType() && fromDataValueInfo->IsJsType());
        return this->MergeJsTypeValueInfo(toDataValueInfo->AsJsType(), fromDataValueInfo->AsJsType(), isLoopBackEdge, sameValueNumber);
    }

    // Same value
    if (toDataValueInfo == fromDataValueInfo)
    {
        return toDataValueInfo;
    }

    ValueType newValueType(toDataValueInfo->Type().Merge(fromDataValueInfo->Type()));
    if (newValueType.IsLikelyInt())
    {
        return ValueInfo::MergeLikelyIntValueInfo(this->globOpt->alloc, toDataVal, fromDataVal, newValueType);
    }
    if(newValueType.IsLikelyAnyOptimizedArray())
    {
        if(newValueType.IsLikelyArrayOrObjectWithArray() &&
            toDataValueInfo->IsLikelyArrayOrObjectWithArray() &&
            fromDataValueInfo->IsLikelyArrayOrObjectWithArray())
        {
            // Value type merge for missing values is aggressive by default (for profile data) - if either side likely has no
            // missing values, then the merged value type also likely has no missing values. This is because arrays often start
            // off having missing values but are eventually filled up. In GlobOpt however, we need to be conservative because
            // the existence of a value type that likely has missing values indicates that it is more likely for it to have
            // missing values than not. Also, StElems that are likely to create missing values are tracked in profile data and
            // will update value types to say they are now likely to have missing values, and that needs to be propagated
            // conservatively.
            newValueType =
                newValueType.SetHasNoMissingValues(
                    toDataValueInfo->HasNoMissingValues() && fromDataValueInfo->HasNoMissingValues());

            if(toDataValueInfo->HasIntElements() != fromDataValueInfo->HasIntElements() ||
                toDataValueInfo->HasFloatElements() != fromDataValueInfo->HasFloatElements())
            {
                // When merging arrays with different native storage types, make the merged value type a likely version to force
                // array checks to be done again and cause a conversion and/or bailout as necessary
                newValueType = newValueType.ToLikely();
            }
        }

        if(!(newValueType.IsObject() && toDataValueInfo->IsArrayValueInfo() && fromDataValueInfo->IsArrayValueInfo()))
        {
            return ValueInfo::New(this->globOpt->alloc, newValueType);
        }

        return
            this->MergeArrayValueInfo(
                newValueType,
                toDataValueInfo->AsArrayValueInfo(),
                fromDataValueInfo->AsArrayValueInfo(),
                fromDataSym,
                symsRequiringCompensation,
                symsCreatedForMerge,
                isLoopBackEdge);
    }

    // Consider: If both values are VarConstantValueInfo with the same value, we could
    // merge them preserving the value.
    return ValueInfo::New(this->globOpt->alloc, newValueType);
}